

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlattenPass.cpp
# Opt level: O0

PreservedAnalyses * __thiscall
Flatten::run(PreservedAnalyses *__return_storage_ptr__,Flatten *this,Module *M,
            ModuleAnalysisManager *AM)

{
  CallGraphNode *F_00;
  bool bVar1;
  Function *Caller_00;
  iterator_range<llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::Function,_false,_false,_void>,_false,_false>_>
  iVar2;
  CallGraphNode *local_130;
  Function *local_128;
  CallGraphNode *local_120;
  CallGraphNode *Caller;
  CallGraphNode *CGN;
  Function *F;
  ilist_iterator<llvm::ilist_detail::node_options<llvm::Function,_false,_false,_void>,_false,_false>
  __end2;
  ilist_iterator<llvm::ilist_detail::node_options<llvm::Function,_false,_false,_void>,_false,_false>
  __begin2;
  iterator_range<llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::Function,_false,_false,_void>,_false,_false>_>
  *__range2;
  CallGraph local_d0 [8];
  CallGraph CG;
  undefined1 local_88 [8];
  SmallSetVector<llvm::Function_*,_4U> ModifiedFunctions;
  bool ModifiedOne;
  bool ModifiedAny;
  ModuleAnalysisManager *AM_local;
  Module *M_local;
  Flatten *this_local;
  
  ModifiedFunctions.
  super_SetVector<llvm::Function_*,_llvm::SmallVector<llvm::Function_*,_4U>,_llvm::SmallDenseSet<llvm::Function_*,_4U,_llvm::DenseMapInfo<llvm::Function_*,_void>_>_>
  .vector_.super_SmallVectorStorage<llvm::Function_*,_4U>.InlineElts[0x1f] = '\0';
  ModifiedFunctions.
  super_SetVector<llvm::Function_*,_llvm::SmallVector<llvm::Function_*,_4U>,_llvm::SmallDenseSet<llvm::Function_*,_4U,_llvm::DenseMapInfo<llvm::Function_*,_void>_>_>
  .vector_.super_SmallVectorStorage<llvm::Function_*,_4U>.InlineElts[0x1e] = '\0';
  llvm::SmallSetVector<llvm::Function_*,_4U>::SmallSetVector
            ((SmallSetVector<llvm::Function_*,_4U> *)local_88);
  do {
    ModifiedFunctions.
    super_SetVector<llvm::Function_*,_llvm::SmallVector<llvm::Function_*,_4U>,_llvm::SmallDenseSet<llvm::Function_*,_4U,_llvm::DenseMapInfo<llvm::Function_*,_void>_>_>
    .vector_.super_SmallVectorStorage<llvm::Function_*,_4U>.InlineElts[0x1e] = '\0';
    llvm::CallGraph::CallGraph(local_d0,M);
    iVar2 = llvm::Module::functions(M);
    __begin2 = iVar2.begin_iterator.NodePtr;
    __end2 = llvm::
             iterator_range<llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::Function,_false,_false,_void>,_false,_false>_>
             ::begin((iterator_range<llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::Function,_false,_false,_void>,_false,_false>_>
                      *)&__begin2);
    F = (Function *)
        llvm::
        iterator_range<llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::Function,_false,_false,_void>,_false,_false>_>
        ::end((iterator_range<llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::Function,_false,_false,_void>,_false,_false>_>
               *)&__begin2);
    while (bVar1 = llvm::operator!=(&__end2,(ilist_iterator<llvm::ilist_detail::node_options<llvm::Function,_false,_false,_void>,_false,_false>
                                             *)&F), bVar1) {
      CGN = (CallGraphNode *)
            llvm::
            ilist_iterator<llvm::ilist_detail::node_options<llvm::Function,_false,_false,_void>,_false,_false>
            ::operator*(&__end2);
      Caller = llvm::CallGraph::operator[](local_d0,(Function *)CGN);
      local_120 = getSingleCaller(this,local_d0,Caller);
      F_00 = CGN;
      if (local_120 != (CallGraphNode *)0x0) {
        Caller_00 = llvm::CallGraphNode::getFunction(local_120);
        bVar1 = inlineFunction(this,(Function *)F_00,Caller_00);
        if (bVar1) {
          local_128 = llvm::CallGraphNode::getFunction(local_120);
          llvm::
          SetVector<llvm::Function_*,_llvm::SmallVector<llvm::Function_*,_4U>,_llvm::SmallDenseSet<llvm::Function_*,_4U,_llvm::DenseMapInfo<llvm::Function_*,_void>_>_>
          ::insert((SetVector<llvm::Function_*,_llvm::SmallVector<llvm::Function_*,_4U>,_llvm::SmallDenseSet<llvm::Function_*,_4U,_llvm::DenseMapInfo<llvm::Function_*,_void>_>_>
                    *)local_88,&local_128);
          local_130 = CGN;
          llvm::
          SetVector<llvm::Function_*,_llvm::SmallVector<llvm::Function_*,_4U>,_llvm::SmallDenseSet<llvm::Function_*,_4U,_llvm::DenseMapInfo<llvm::Function_*,_void>_>_>
          ::remove((SetVector<llvm::Function_*,_llvm::SmallVector<llvm::Function_*,_4U>,_llvm::SmallDenseSet<llvm::Function_*,_4U,_llvm::DenseMapInfo<llvm::Function_*,_void>_>_>
                    *)local_88,(char *)&local_130);
          ModifiedFunctions.
          super_SetVector<llvm::Function_*,_llvm::SmallVector<llvm::Function_*,_4U>,_llvm::SmallDenseSet<llvm::Function_*,_4U,_llvm::DenseMapInfo<llvm::Function_*,_void>_>_>
          .vector_.super_SmallVectorStorage<llvm::Function_*,_4U>.InlineElts[0x1e] = '\x01';
          ModifiedFunctions.
          super_SetVector<llvm::Function_*,_llvm::SmallVector<llvm::Function_*,_4U>,_llvm::SmallDenseSet<llvm::Function_*,_4U,_llvm::DenseMapInfo<llvm::Function_*,_void>_>_>
          .vector_.super_SmallVectorStorage<llvm::Function_*,_4U>.InlineElts[0x1f] = '\x01';
          break;
        }
      }
      llvm::
      ilist_iterator<llvm::ilist_detail::node_options<llvm::Function,_false,_false,_void>,_false,_false>
      ::operator++(&__end2);
    }
    llvm::CallGraph::~CallGraph(local_d0);
    if ((ModifiedFunctions.
         super_SetVector<llvm::Function_*,_llvm::SmallVector<llvm::Function_*,_4U>,_llvm::SmallDenseSet<llvm::Function_*,_4U,_llvm::DenseMapInfo<llvm::Function_*,_void>_>_>
         .vector_.super_SmallVectorStorage<llvm::Function_*,_4U>.InlineElts[0x1e] & 1U) == 0) {
      if ((ModifiedFunctions.
           super_SetVector<llvm::Function_*,_llvm::SmallVector<llvm::Function_*,_4U>,_llvm::SmallDenseSet<llvm::Function_*,_4U,_llvm::DenseMapInfo<llvm::Function_*,_void>_>_>
           .vector_.super_SmallVectorStorage<llvm::Function_*,_4U>.InlineElts[0x1f] & 1U) == 0) {
        llvm::PreservedAnalyses::all();
      }
      else {
        llvm::PreservedAnalyses::none();
      }
      llvm::SmallSetVector<llvm::Function_*,_4U>::~SmallSetVector
                ((SmallSetVector<llvm::Function_*,_4U> *)local_88);
      return __return_storage_ptr__;
    }
  } while( true );
}

Assistant:

llvm::PreservedAnalyses Flatten::run(Module &M, ModuleAnalysisManager &AM) {
  bool ModifiedAny = false;
  bool ModifiedOne = false;
  SmallSetVector<Function *, 4> ModifiedFunctions;

  // We keep running, inlining functions into other functions, until there's
  // no work left to do.
  do {
    ModifiedOne = false;

    // Build the call graph of the entire module.
    CallGraph CG(M);

    for (Function &F : M.functions()) {
      CallGraphNode *CGN = CG[&F];
      CallGraphNode *Caller = getSingleCaller(CG, CGN);

      if (Caller == nullptr) {
        continue; // We need a function with a single caller function
      }

      if (inlineFunction(&F, Caller->getFunction())) {
        // Keep track of functions that need reg2mem
        ModifiedFunctions.insert(Caller->getFunction());
        ModifiedFunctions.remove(&F);

        // Mark the module as modified and start over
        ModifiedOne = true;
        ModifiedAny = true;
        break;
      }
    }

  } while (ModifiedOne);

  if (ModifiedAny) {
    return llvm::PreservedAnalyses::none();
  }
  return llvm::PreservedAnalyses::all();
}